

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
SetPropertyWithAttributes
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  int iVar4;
  uint32 index;
  BOOL BVar5;
  undefined4 *puVar6;
  ScriptContext *pSVar7;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar8;
  DictionaryTypeHandlerBase<int> *pDVar9;
  DynamicType *pDVar10;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *this_00;
  PropertyRecord **ppPVar11;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *pSVar12;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar13;
  RecyclerWeakReference<Js::DynamicObject> *this_01;
  ScriptContext *scriptContext_00;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_02;
  bool local_8a;
  bool local_89;
  GlobalObject *local_88;
  undefined1 local_78 [16];
  DynamicObject *localSingletonInstance;
  bool isForce;
  Type TStack_60;
  int propertyIndex;
  PropertyRecord *propertyRecord;
  Type TStack_50;
  bool throwIfNotExtensible;
  ScriptContext *scriptContext;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyValueInfo *info_local;
  Type TStack_30;
  PropertyAttributes attributes_local;
  Var value_local;
  Type TStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this_local;
  
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)info;
  info_local._7_1_ = attributes;
  TStack_30.ptr = (RuntimeFunction *)value;
  value_local._4_4_ = propertyId;
  TStack_20.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92a,"(instance)","instance");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  TStack_50.ptr = (RuntimeFunction *)RecyclableObject::GetScriptContext(TStack_20.ptr);
  propertyRecord._7_1_ = (flags & PropertyOperation_ThrowIfNotExtensible) != PropertyOperation_None;
  if (value_local._4_4_ == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92f,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
  TStack_60.ptr = (RuntimeFunction *)ScriptContext::GetPropertyName(pSVar7,value_local._4_4_);
  pBVar8 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
           ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)pBVar8,(PropertyRecord **)&stack0xffffffffffffffa0,
                     (SimpleDictionaryPropertyDescriptor<int> **)&scriptContext);
  if (!bVar3) {
    bVar3 = PropertyRecord::IsNumeric((PropertyRecord *)TStack_60.ptr);
    TVar2.ptr = TStack_20.ptr;
    if (!bVar3) {
      BVar5 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
              AddProperty<Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)this
                         ,(DynamicObject *)TStack_20.ptr,(PropertyRecord *)TStack_60.ptr,
                         TStack_30.ptr,info_local._7_1_,(PropertyValueInfo *)descriptor,flags,
                         possibleSideEffects);
      return BVar5;
    }
    index = PropertyRecord::GetNumericValue((PropertyRecord *)TStack_60.ptr);
    BVar5 = DynamicTypeHandler::SetItemWithAttributes
                      (&this->super_DynamicTypeHandler,(DynamicObject *)TVar2.ptr,index,
                       TStack_30.ptr,info_local._7_1_);
    return BVar5;
  }
  if ((info_local._7_1_ & 0x10) !=
      (*(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) & 0x10
      )) {
    pDVar9 = ConvertToDictionaryType(this,(DynamicObject *)TStack_20.ptr);
    iVar4 = (*(pDVar9->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                      (pDVar9,TStack_20.ptr,(ulong)value_local._4_4_,TStack_30.ptr,
                       (ulong)info_local._7_1_,descriptor,flags,(uint)possibleSideEffects);
    return iVar4;
  }
  if ((((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x800) != 0) &&
     (((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x1000) == 0)) {
    if (((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x1000) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x950,"((descriptor->Attributes & 0x10) == 0)",
                                  "(descriptor->Attributes & PropertyLetConstGlobal) == 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar3 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
    if (bVar3) {
      pSVar12 = ConvertToNonSharedSimpleDictionaryType(this,(DynamicObject *)TStack_20.ptr);
      BVar5 = SetPropertyWithAttributes
                        (pSVar12,(DynamicObject *)TStack_20.ptr,value_local._4_4_,TStack_30.ptr,
                         info_local._7_1_,(PropertyValueInfo *)descriptor,flags,possibleSideEffects)
      ;
      return BVar5;
    }
    pDVar10 = DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr);
    bVar3 = DynamicType::GetIsLocked(pDVar10);
    if (bVar3) {
      bVar3 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
      if (bVar3) {
LAB_0144bd42:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x960,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      else {
        pDVar10 = DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr);
        bVar3 = DynamicType::GetIsShared(pDVar10);
        if (bVar3) goto LAB_0144bd42;
      }
      DynamicObject::ChangeType((DynamicObject *)TStack_20.ptr);
    }
    if (((byte)this->field_0x28 >> 1 & 1) != 0) {
      this_00 = AsUnordered(this);
      bVar3 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::
              TryUndeleteProperty(this_00,(DynamicObject *)TStack_20.ptr,
                                  *(int *)((long)&(scriptContext->super_ScriptContextInfo).
                                                  _vptr_ScriptContextInfo + 4),
                                  (int *)((long)&localSingletonInstance + 4));
      if (bVar3) {
        pBVar8 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->propertyMap);
        ppPVar11 = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetKeyAt(pBVar8,localSingletonInstance._4_4_);
        bVar3 = PropertyRecordStringHashComparer<const_Js::PropertyRecord_*>::Equals
                          (*ppPVar11,(PropertyRecord *)TStack_60.ptr);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x96b,
                                      "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord))"
                                      ,
                                      "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord)"
                                     );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pBVar8 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->propertyMap);
        scriptContext =
             (ScriptContext *)
             JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
             ::GetReferenceAt(pBVar8,localSingletonInstance._4_4_);
      }
    }
    localSingletonInstance._3_1_ = (flags & PropertyOperation_Force) != PropertyOperation_None;
    if ((!(bool)localSingletonInstance._3_1_) &&
       (bVar3 = DynamicTypeHandler::VerifyIsExtensible
                          (&this->super_DynamicTypeHandler,(ScriptContext *)TStack_50.ptr,
                           (bool)(propertyRecord._7_1_ & 1)), !bVar3)) {
      return 0;
    }
    bVar3 = SupportsSwitchingToUnordered(this,(ScriptContext *)TStack_50.ptr);
    if (bVar3) {
      this->numDeletedProperties = this->numDeletedProperties + 0xff;
    }
    ScriptContext::InvalidateProtoCaches((ScriptContext *)TStack_50.ptr,value_local._4_4_);
    *(undefined1 *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) = 7
    ;
  }
  if (*(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) ==
      info_local._7_1_) goto LAB_0144c044;
  bVar3 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
  if (bVar3) {
    pSVar12 = ConvertToNonSharedSimpleDictionaryType(this,(DynamicObject *)TStack_20.ptr);
    BVar5 = SetPropertyWithAttributes
                      (pSVar12,(DynamicObject *)TStack_20.ptr,value_local._4_4_,TStack_30.ptr,
                       info_local._7_1_,(PropertyValueInfo *)descriptor,flags,possibleSideEffects);
    return BVar5;
  }
  pDVar10 = DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr);
  bVar3 = DynamicType::GetIsLocked(pDVar10);
  if (bVar3) {
    bVar3 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
    if (bVar3) {
LAB_0144bfc2:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x997,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    else {
      pDVar10 = DynamicObject::GetDynamicType((DynamicObject *)TStack_20.ptr);
      bVar3 = DynamicType::GetIsShared(pDVar10);
      if (bVar3) goto LAB_0144bfc2;
    }
    DynamicObject::ChangeType((DynamicObject *)TStack_20.ptr);
  }
  *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) =
       info_local._7_1_;
LAB_0144c044:
  if (*(int *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 4) != -1) {
    ppRVar13 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    if (*ppRVar13 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_88 = (GlobalObject *)0x0;
    }
    else {
      this_01 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->(&this->singletonInstance);
      local_88 = (GlobalObject *)Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_01);
    }
    local_78._8_8_ = local_88;
    ppRVar13 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    if ((*ppRVar13 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((RuntimeFunction *)local_78._8_8_ != TStack_20.ptr)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x9a5,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pSVar7 = scriptContext;
    TVar2.ptr = TStack_60.ptr;
    if ((*(byte *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo >> 1 & 1) == 0)
    {
      if (((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
           (*(byte *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo =
                 *(byte *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0xfd |
                 2, (RuntimeFunction *)local_78._8_8_ == TStack_20.ptr)) &&
          (BVar5 = IsInternalPropertyId(value_local._4_4_), BVar5 == 0)) &&
         ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None)) {
        bVar3 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x9af,"(!GetIsShared())","!GetIsShared()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if (TStack_30.ptr == (RuntimeFunction *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x9b0,"(value != nullptr)","value != nullptr");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        BVar5 = RecyclableObject::IsExternal((RecyclableObject *)TStack_20.ptr);
        if (BVar5 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x9b2,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        bVar3 = VarIs<Js::JavascriptFunction>(TStack_30.ptr);
        if (bVar3) {
          local_89 = DynamicTypeHandler::ShouldFixMethodProperties();
        }
        else {
          bVar3 = DynamicTypeHandler::ShouldFixDataProperties();
          local_8a = false;
          if (bVar3) {
            local_8a = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                                 ((DynamicObject *)TStack_20.ptr,value_local._4_4_,TStack_30.ptr);
          }
          local_89 = local_8a;
        }
        *(byte *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo =
             *(byte *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0xfb |
             local_89 << 2;
      }
    }
    else {
      scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
      SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
      InvalidateFixedField<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)this,
                 (PropertyRecord *)TVar2.ptr,(SimpleDictionaryPropertyDescriptor<int> *)pSVar7,
                 scriptContext_00);
    }
    DynamicTypeHandler::SetSlotUnchecked
              ((DynamicObject *)TStack_20.ptr,
               *(int *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 4)
               ,TStack_30.ptr);
    bVar3 = SimpleDictionaryPropertyDescriptor<int>::IsOrMayBecomeFixed
                      ((SimpleDictionaryPropertyDescriptor<int> *)scriptContext);
    if (bVar3) {
      PropertyValueInfo::SetNoCache
                ((PropertyValueInfo *)descriptor,(RecyclableObject *)TStack_20.ptr);
    }
    else {
      SetPropertyValueInfoNonFixed
                (this,(PropertyValueInfo *)descriptor,(RecyclableObject *)TStack_20.ptr,
                 *(BigPropertyIndex *)
                  ((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 4),
                 *(PropertyAttributes *)
                  ((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1),
                 InlineCacheNoFlags);
    }
  }
  if (((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x100) != 0) {
    DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)TStack_20.ptr,false);
  }
  RecyclableObject::GetLibrary((RecyclableObject *)TStack_20.ptr);
  JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache((JavascriptLibrary *)local_78);
  this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                       local_78);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
            (this_02,&this->super_DynamicTypeHandler,
             *(PropertyAttributes *)
              ((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1),
             value_local._4_4_,(ScriptContext *)TStack_50.ptr);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,(DynamicObject *)TStack_20.ptr,value_local._4_4_,
             TStack_30.ptr,possibleSideEffects);
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((attributes & PropertyLetConstGlobal) != (descriptor->Attributes & PropertyLetConstGlobal))
            {
                // We have a shadowing case here.  Either a let/const is being declared
                // that shadows an undeclared global property or an undeclared global
                // property is being added after a let/const was already declared.
                //
                // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
                // because we do not want to add another property index field to the
                // property descriptors.  Instead convert to DictionaryTypeHandler
                // where it will reuse one of the getter/setter fields on its
                // property descriptor type.
                //
                // An exception is in the language service that will sometimes execute
                // the glo function twice causing a const or let appear to shadow itself.
                // In this case setting the property is also right.
                return
                    ConvertToDictionaryType(instance)
                        ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
            }

            if (descriptor->Attributes & PropertyDeleted && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                Assert((descriptor->Attributes & PropertyLetConstGlobal) == 0);
                if(GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else if (instance->GetDynamicType()->GetIsLocked())
                {
                    Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                    // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                    instance->ChangeType();
                }

                if(isUnordered)
                {
                    TPropertyIndex propertyIndex;
                    if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                    {
                        Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord));
                        descriptor = propertyMap->GetReferenceAt(propertyIndex);
                    }
                }

                if (IsNotExtensibleSupported)
                {
                    bool isForce = (flags & PropertyOperation_Force) != 0;
                    if (!isForce)
                    {
                        if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                        {
                            return FALSE;
                        }
                    }
                }

                if(SupportsSwitchingToUnordered(scriptContext))
                {
                    --numDeletedProperties;
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }

            if (descriptor->Attributes != attributes)
            {
                if (GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else
                {
                    if (instance->GetDynamicType()->GetIsLocked())
                    {
                        Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                        // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                        instance->ChangeType();
                    }

                    descriptor->Attributes = attributes;
                }
            }

            if (descriptor->propertyIndex != NoSlots)
            {
#if ENABLE_FIXED_FIELDS
                DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
                Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
                if (!descriptor->isInitialized)
                {
                    if ((flags & PropertyOperation_PreInit) == 0)
                    {
                        // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                        // some other special illegal value (for let or const), currently == null.
                        descriptor->isInitialized = true;
                        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) && (flags & (PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue)) == 0)
                        {
                            Assert(!GetIsShared());
                            Assert(value != nullptr);
                            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                            Assert(!instance->IsExternal());
                            descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                        }
                    }
                }
                else
                {
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
                }
#endif
                SetSlotUnchecked(instance, descriptor->propertyIndex, value);

                if (!descriptor->IsOrMayBecomeFixed())
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. May create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
    }